

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConvexAlgorithm.cpp
# Opt level: O1

cbtScalar __thiscall
cbtConvexConvexAlgorithm::calculateTimeOfImpact
          (cbtConvexConvexAlgorithm *this,cbtCollisionObject *col0,cbtCollisionObject *col1,
          cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  cbtCollisionShape *pcVar2;
  float fVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cbtGjkConvexCast ccd1;
  cbtSphereShape sphere1;
  CastResult result;
  cbtVoronoiSimplexSolver voronoiSimplex;
  float local_2f0;
  cbtGjkConvexCast local_2c8;
  cbtConvexInternalShape local_2a8;
  CastResult local_260;
  cbtVoronoiSimplexSolver local_198;
  
  fVar3 = (col0->m_interpolationWorldTransform).m_origin.m_floats[1] -
          (col0->m_worldTransform).m_origin.m_floats[1];
  auVar5 = ZEXT416((uint)((col0->m_interpolationWorldTransform).m_origin.m_floats[0] -
                         (col0->m_worldTransform).m_origin.m_floats[0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar5,auVar5);
  auVar6 = ZEXT416((uint)((col0->m_interpolationWorldTransform).m_origin.m_floats[2] -
                         (col0->m_worldTransform).m_origin.m_floats[2]));
  auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
  if (auVar5._0_4_ < col0->m_ccdMotionThreshold * col0->m_ccdMotionThreshold) {
    fVar3 = (col1->m_interpolationWorldTransform).m_origin.m_floats[1] -
            (col1->m_worldTransform).m_origin.m_floats[1];
    auVar5 = ZEXT416((uint)((col1->m_interpolationWorldTransform).m_origin.m_floats[0] -
                           (col1->m_worldTransform).m_origin.m_floats[0]));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * fVar3)),auVar5,auVar5);
    auVar6 = ZEXT416((uint)((col1->m_interpolationWorldTransform).m_origin.m_floats[2] -
                           (col1->m_worldTransform).m_origin.m_floats[2]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar6,auVar6);
    if (auVar5._0_4_ < col1->m_ccdMotionThreshold * col1->m_ccdMotionThreshold) {
      return 1.0;
    }
  }
  if (disableCcd) {
    return 1.0;
  }
  pcVar2 = col0->m_collisionShape;
  cVar1 = col1->m_ccdSweptSphereRadius;
  cbtConvexInternalShape::cbtConvexInternalShape(&local_2a8);
  local_2a8.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b72170;
  local_2a8.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 8;
  local_2a8.super_cbtConvexShape.super_cbtCollisionShape._28_4_ = 0x3f800000;
  local_2a8._32_4_ = 0x3f800000;
  local_2a8._36_4_ = 0x3f800000;
  local_2a8.m_implicitShapeDimensions.m_floats[1] = 0.0;
  local_2a8.m_implicitShapeDimensions.m_floats[2] = 0.0;
  local_2a8.m_implicitShapeDimensions.m_floats[3] = 0.0;
  local_2a8._40_8_ = (ulong)(uint)cVar1 << 0x20;
  local_2a8.m_padding = 0.0;
  local_260._vptr_CastResult = (_func_int **)&PTR_DebugDraw_00b6ffb0;
  local_260.m_fraction = 1e+18;
  local_260.m_debugDrawer = (cbtIDebugDraw *)0x0;
  local_260.m_allowedPenetration = 0.0;
  local_260.m_subSimplexCastMaxIterations = 0x20;
  local_260.m_subSimplexCastEpsilon = 0.0001;
  local_198.m_equalVertexThreshold = 0.0001;
  local_198.m_cachedBC.m_usedVertices._0_1_ = local_198.m_cachedBC.m_usedVertices._0_1_ & 0xf0;
  local_2a8.m_collisionMargin = cVar1;
  cbtGjkConvexCast::cbtGjkConvexCast
            (&local_2c8,(cbtConvexShape *)pcVar2,&local_2a8.super_cbtConvexShape,&local_198);
  bVar4 = cbtGjkConvexCast::calcTimeOfImpact
                    (&local_2c8,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                     &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_260);
  if (bVar4) {
    if (local_260.m_fraction < col0->m_hitFraction) {
      col0->m_hitFraction = local_260.m_fraction;
    }
    if (local_260.m_fraction < col1->m_hitFraction) {
      col1->m_hitFraction = local_260.m_fraction;
    }
    local_2f0 = 1.0;
    fVar3 = local_260.m_fraction;
    if (1.0 <= local_260.m_fraction) {
      fVar3 = local_2f0;
    }
  }
  else {
    fVar3 = 1.0;
  }
  local_2f0 = fVar3;
  cbtConvexCast::~cbtConvexCast(&local_2c8.super_cbtConvexCast);
  cbtConvexShape::~cbtConvexShape(&local_2a8.super_cbtConvexShape);
  pcVar2 = col1->m_collisionShape;
  cVar1 = col0->m_ccdSweptSphereRadius;
  cbtConvexInternalShape::cbtConvexInternalShape(&local_2a8);
  local_2a8.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b72170;
  local_2a8.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 8;
  local_2a8.super_cbtConvexShape.super_cbtCollisionShape._28_4_ = 0x3f800000;
  local_2a8._32_4_ = 0x3f800000;
  local_2a8._36_4_ = 0x3f800000;
  local_2a8.m_implicitShapeDimensions.m_floats[1] = 0.0;
  local_2a8.m_implicitShapeDimensions.m_floats[2] = 0.0;
  local_2a8.m_implicitShapeDimensions.m_floats[3] = 0.0;
  local_2a8._40_8_ = (ulong)(uint)cVar1 << 0x20;
  local_2a8.m_padding = 0.0;
  local_260._vptr_CastResult = (_func_int **)&PTR_DebugDraw_00b6ffb0;
  local_260.m_fraction = 1e+18;
  local_260.m_debugDrawer = (cbtIDebugDraw *)0x0;
  local_260.m_allowedPenetration = 0.0;
  local_260.m_subSimplexCastMaxIterations = 0x20;
  local_260.m_subSimplexCastEpsilon = 0.0001;
  local_198.m_equalVertexThreshold = 0.0001;
  local_198.m_cachedBC.m_usedVertices._0_1_ = local_198.m_cachedBC.m_usedVertices._0_1_ & 0xf0;
  local_2a8.m_collisionMargin = cVar1;
  cbtGjkConvexCast::cbtGjkConvexCast
            (&local_2c8,&local_2a8.super_cbtConvexShape,(cbtConvexShape *)pcVar2,&local_198);
  bVar4 = cbtGjkConvexCast::calcTimeOfImpact
                    (&local_2c8,&col0->m_worldTransform,&col0->m_interpolationWorldTransform,
                     &col1->m_worldTransform,&col1->m_interpolationWorldTransform,&local_260);
  if (bVar4) {
    if (local_260.m_fraction < col0->m_hitFraction) {
      col0->m_hitFraction = local_260.m_fraction;
    }
    if (local_260.m_fraction < col1->m_hitFraction) {
      col1->m_hitFraction = local_260.m_fraction;
    }
    if (local_260.m_fraction < local_2f0) {
      local_2f0 = local_260.m_fraction;
    }
  }
  cbtConvexCast::~cbtConvexCast(&local_2c8.super_cbtConvexCast);
  cbtConvexShape::~cbtConvexShape(&local_2a8.super_cbtConvexShape);
  return local_2f0;
}

Assistant:

cbtScalar cbtConvexConvexAlgorithm::calculateTimeOfImpact(cbtCollisionObject* col0, cbtCollisionObject* col1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	///Rather then checking ALL pairs, only calculate TOI when motion exceeds threshold

	///Linear motion for one of objects needs to exceed m_ccdSquareMotionThreshold
	///col0->m_worldTransform,
	cbtScalar resultFraction = cbtScalar(1.);

	cbtScalar squareMot0 = (col0->getInterpolationWorldTransform().getOrigin() - col0->getWorldTransform().getOrigin()).length2();
	cbtScalar squareMot1 = (col1->getInterpolationWorldTransform().getOrigin() - col1->getWorldTransform().getOrigin()).length2();

	if (squareMot0 < col0->getCcdSquareMotionThreshold() &&
		squareMot1 < col1->getCcdSquareMotionThreshold())
		return resultFraction;

	if (disableCcd)
		return cbtScalar(1.);

	//An adhoc way of testing the Continuous Collision Detection algorithms
	//One object is approximated as a sphere, to simplify things
	//Starting in penetration should report no time of impact
	//For proper CCD, better accuracy and handling of 'allowed' penetration should be added
	//also the mainloop of the physics should have a kind of toi queue (something like Brian Mirtich's application of Timewarp for Rigidbodies)

	/// Convex0 against sphere for Convex1
	{
		cbtConvexShape* convex0 = static_cast<cbtConvexShape*>(col0->getCollisionShape());

		cbtSphereShape sphere1(col1->getCcdSweptSphereRadius());  //todo: allow non-zero sphere sizes, for better approximation
		cbtConvexCast::CastResult result;
		cbtVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		cbtGjkConvexCast ccd1(convex0, &sphere1, &voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(), col0->getInterpolationWorldTransform(),
								  col1->getWorldTransform(), col1->getInterpolationWorldTransform(), result))
		{
			//store result.m_fraction in both bodies

			if (col0->getHitFraction() > result.m_fraction)
				col0->setHitFraction(result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction(result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;
		}
	}

	/// Sphere (for convex0) against Convex1
	{
		cbtConvexShape* convex1 = static_cast<cbtConvexShape*>(col1->getCollisionShape());

		cbtSphereShape sphere0(col0->getCcdSweptSphereRadius());  //todo: allow non-zero sphere sizes, for better approximation
		cbtConvexCast::CastResult result;
		cbtVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		cbtGjkConvexCast ccd1(&sphere0, convex1, &voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(), col0->getInterpolationWorldTransform(),
								  col1->getWorldTransform(), col1->getInterpolationWorldTransform(), result))
		{
			//store result.m_fraction in both bodies

			if (col0->getHitFraction() > result.m_fraction)
				col0->setHitFraction(result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction(result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;
		}
	}

	return resultFraction;
}